

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O2

void CreateBackwardReferencesNH3
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong *puVar1;
  size_t sVar2;
  ushort uVar3;
  short sVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong *puVar8;
  ulong *puVar9;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint8_t uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  char cVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_e8;
  ulong local_e0;
  size_t *local_d8;
  ulong local_b8 [4];
  ulong local_98;
  ulong local_90;
  int local_84;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  long local_50;
  long local_48;
  ulong local_40;
  BrotliEncoderParams *local_38;
  
  local_38 = params;
  local_98 = (1L << (literal_context_lut[8] & 0x3f)) - 0x10;
  local_78 = (position - 7) + num_bytes;
  local_40 = position;
  if (7 < num_bytes) {
    local_40 = local_78;
  }
  local_48 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    local_48 = 0x40;
  }
  local_b8[3] = position + num_bytes;
  local_50 = *(long *)(literal_context_lut + 0x10);
  uVar24 = *(ulong *)dist_cache;
  local_90 = local_48 + position;
  local_58 = *(long *)(literal_context_lut + 0x60);
  local_70 = ringbuffer_mask & 0xffffffff;
  local_60 = (ulong)(uint)((int)local_48 * 4);
  local_d8 = last_insert_len;
  uVar21 = local_60;
  uVar22 = local_b8[3];
  do {
LAB_01f3d243:
    uVar17 = position;
    if (uVar22 <= uVar17 + 8) {
      *(ulong *)dist_cache = (uVar24 + uVar22) - uVar17;
      *(long *)commands = *(long *)commands + ((long)local_d8 - (long)last_insert_len >> 4);
      return;
    }
    local_e0 = uVar22 - uVar17;
    uVar22 = local_98;
    if (uVar17 < local_98) {
      uVar22 = uVar17;
    }
    uVar25 = uVar17 & ringbuffer_mask;
    puVar1 = (ulong *)(ringbuffer + uVar25);
    uVar14 = ringbuffer[uVar25];
    local_100 = (ulong)*(int *)(hasher->common).extra;
    local_e8 = 0x7e4;
    local_70._0_4_ = (uint)ringbuffer_mask;
    if ((uVar17 - local_100 < uVar17) &&
       (uVar5 = (uint)(uVar17 - local_100) & (uint)local_70, uVar14 == ringbuffer[uVar5])) {
      puVar8 = (ulong *)(ringbuffer + uVar5);
      lVar19 = 0;
      puVar9 = puVar1;
      uVar16 = local_e0;
LAB_01f3d2b1:
      if (uVar16 < 8) {
        for (uVar26 = 0;
            (uVar16 != uVar26 &&
            (*(char *)((long)puVar8 + uVar26) == *(char *)((long)puVar9 + uVar26)));
            uVar26 = uVar26 + 1) {
        }
        uVar26 = uVar26 - lVar19;
      }
      else {
        if (*puVar9 == *puVar8) break;
        uVar26 = *puVar8 ^ *puVar9;
        uVar16 = 0;
        if (uVar26 != 0) {
          for (; (uVar26 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
          }
        }
        uVar26 = (uVar16 >> 3 & 0x1fffffff) - lVar19;
      }
      if ((uVar26 < 4) || (uVar16 = uVar26 * 0x87 + 0x78f, uVar16 < 0x7e5)) goto LAB_01f3d32f;
      uVar14 = *(uint8_t *)((long)puVar1 + uVar26);
      local_e8 = uVar16;
    }
    else {
LAB_01f3d32f:
      local_100 = 0;
      uVar26 = 0;
    }
    sVar2 = (params->dictionary).compound.num_chunks;
    local_b8[0] = (ulong)(*(long *)(ringbuffer + uVar25) * 0x7bd3579bd3000000) >> 0x30;
    local_b8[1] = (ulong)((ushort)((ulong)(*(long *)(ringbuffer + uVar25) * 0x7bd3579bd3000000) >>
                                  0x30) + 8 & 0xffff);
    for (lVar19 = 0; lVar19 != 2; lVar19 = lVar19 + 1) {
      uVar5 = *(uint *)(sVar2 + local_b8[lVar19] * 4);
      puVar9 = (ulong *)(ringbuffer + ((uint)local_70 & uVar5));
      if (((uVar14 == *(uint8_t *)(uVar26 + (long)puVar9)) && (uVar17 != uVar5)) &&
         (uVar25 = uVar17 - uVar5, uVar25 <= uVar22)) {
        lVar20 = 0;
        uVar16 = local_e0;
        puVar8 = puVar1;
LAB_01f3d3c2:
        if (uVar16 < 8) {
          for (uVar11 = 0;
              (uVar16 != uVar11 &&
              (*(char *)((long)puVar9 + uVar11) == *(char *)((long)puVar8 + uVar11)));
              uVar11 = uVar11 + 1) {
          }
        }
        else {
          if (*puVar8 == *puVar9) goto code_r0x01f3d3d3;
          uVar11 = *puVar9 ^ *puVar8;
          uVar16 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
            }
          }
          uVar11 = uVar16 >> 3 & 0x1fffffff;
        }
        uVar11 = uVar11 - lVar20;
        if (3 < uVar11) {
          iVar15 = 0x1f;
          if ((uint)uVar25 != 0) {
            for (; (uint)uVar25 >> iVar15 == 0; iVar15 = iVar15 + -1) {
            }
          }
          uVar16 = (ulong)(iVar15 * -0x1e + 0x780) + uVar11 * 0x87;
          if (local_e8 < uVar16) {
            uVar14 = *(uint8_t *)((long)puVar1 + uVar11);
            uVar26 = uVar11;
            local_100 = uVar25;
            local_e8 = uVar16;
          }
        }
      }
    }
    *(uint *)(sVar2 + *(long *)((long)local_b8 + (ulong)((uint)uVar17 & 8)) * 4) = (uint)uVar17;
    uVar22 = local_b8[3];
    if (local_e8 < 0x7e5) {
      uVar24 = uVar24 + 1;
      position = uVar17 + 1;
      if (local_90 < position) {
        if (uVar21 + local_90 < position) {
          uVar25 = uVar17 + 0x11;
          if (local_78 <= uVar17 + 0x11) {
            uVar25 = local_78;
          }
          for (; uVar22 = local_b8[3], position < uVar25; position = position + 4) {
            *(uint *)(sVar2 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                      (position & ringbuffer_mask))
                                                            * 0x7bd3579bd3000000) >> 0x30) +
                                      ((uint)position & 8) & 0xffff) * 4) = (uint)position;
            uVar24 = uVar24 + 4;
          }
        }
        else {
          uVar25 = uVar17 + 9;
          if (local_78 <= uVar17 + 9) {
            uVar25 = local_78;
          }
          for (; uVar22 = local_b8[3], position < uVar25; position = position + 2) {
            *(uint *)(sVar2 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                      (position & ringbuffer_mask))
                                                            * 0x7bd3579bd3000000) >> 0x30) +
                                      ((uint)position & 8) & 0xffff) * 4) = (uint)position;
            uVar24 = uVar24 + 2;
          }
        }
      }
      goto LAB_01f3d243;
    }
    local_80 = (ulong)*(int *)(hasher->common).extra;
    local_68 = uVar24 + 4;
    local_84 = 0;
    uVar21 = uVar24;
    do {
      local_e0 = local_e0 - 1;
      uVar25 = uVar26 - 1;
      if (local_e0 <= uVar26 - 1) {
        uVar25 = local_e0;
      }
      if (4 < *(int *)(literal_context_lut + 4)) {
        uVar25 = 0;
      }
      uVar16 = uVar17 + 1;
      local_90 = local_98;
      if (uVar16 < local_98) {
        local_90 = uVar16;
      }
      puVar1 = (ulong *)(ringbuffer + (uVar16 & ringbuffer_mask));
      cVar23 = *(char *)(uVar25 + (long)puVar1);
      local_108 = 0x7e4;
      if ((uVar16 - local_80 < uVar16) &&
         (puVar9 = (ulong *)(ringbuffer + ((uint)(uVar16 - local_80) & (uint)local_70)),
         cVar23 == *(char *)(uVar25 + (long)puVar9))) {
        lVar19 = 0;
        uVar11 = local_e0;
        puVar8 = puVar1;
LAB_01f3d5d5:
        if (uVar11 < 8) {
          for (uVar12 = 0;
              (uVar11 != uVar12 &&
              (*(char *)((long)puVar9 + uVar12) == *(char *)((long)puVar8 + uVar12)));
              uVar12 = uVar12 + 1) {
          }
        }
        else {
          if (*puVar8 == *puVar9) goto code_r0x01f3d5e6;
          uVar12 = *puVar9 ^ *puVar8;
          uVar11 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
            }
          }
          uVar12 = uVar11 >> 3 & 0x1fffffff;
        }
        uVar12 = uVar12 - lVar19;
        if ((uVar12 < 4) || (uVar11 = uVar12 * 0x87 + 0x78f, uVar11 < 0x7e5)) {
          local_110 = 0;
        }
        else {
          cVar23 = *(char *)((long)puVar1 + uVar12);
          uVar25 = uVar12;
          local_110 = local_80;
          local_108 = uVar11;
        }
      }
      else {
        local_110 = 0;
      }
      local_b8[0] = (ulong)(*(long *)(ringbuffer + (uVar16 & ringbuffer_mask)) * 0x7bd3579bd3000000)
                    >> 0x30;
      local_b8[1] = (ulong)((ushort)((ulong)(*(long *)(ringbuffer + (uVar16 & ringbuffer_mask)) *
                                            0x7bd3579bd3000000) >> 0x30) + 8 & 0xffff);
      for (lVar19 = 0; lVar19 != 2; lVar19 = lVar19 + 1) {
        uVar5 = *(uint *)(sVar2 + local_b8[lVar19] * 4);
        puVar9 = (ulong *)(ringbuffer + ((uint)local_70 & uVar5));
        if (((cVar23 == *(char *)(uVar25 + (long)puVar9)) && (uVar16 != uVar5)) &&
           (uVar11 = uVar16 - uVar5, uVar11 <= local_90)) {
          lVar20 = 0;
          uVar12 = local_e0;
          puVar8 = puVar1;
LAB_01f3d704:
          if (uVar12 < 8) {
            for (uVar13 = 0;
                (uVar12 != uVar13 &&
                (*(char *)((long)puVar9 + uVar13) == *(char *)((long)puVar8 + uVar13)));
                uVar13 = uVar13 + 1) {
            }
          }
          else {
            if (*puVar8 == *puVar9) goto code_r0x01f3d715;
            uVar13 = *puVar9 ^ *puVar8;
            uVar12 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
              }
            }
            uVar13 = uVar12 >> 3 & 0x1fffffff;
          }
          uVar13 = uVar13 - lVar20;
          if (3 < uVar13) {
            iVar15 = 0x1f;
            if ((uint)uVar11 != 0) {
              for (; (uint)uVar11 >> iVar15 == 0; iVar15 = iVar15 + -1) {
              }
            }
            uVar12 = (ulong)(iVar15 * -0x1e + 0x780) + uVar13 * 0x87;
            if (local_108 < uVar12) {
              cVar23 = *(char *)((long)puVar1 + uVar13);
              uVar25 = uVar13;
              local_110 = uVar11;
              local_108 = uVar12;
            }
          }
        }
      }
      *(uint *)(sVar2 + *(long *)((long)local_b8 + (ulong)((uint)uVar16 & 8)) * 4) = (uint)uVar16;
      uVar11 = uVar17;
      uVar12 = uVar21;
      if ((local_108 < local_e8 + 0xaf) ||
         (local_100 = local_110, uVar11 = uVar16, uVar12 = uVar24 + 4, uVar26 = uVar25,
         local_84 == 3)) break;
      uVar12 = uVar21 + 1;
      local_84 = local_84 + 1;
      uVar25 = uVar17 + 9;
      local_e8 = local_108;
      uVar17 = uVar16;
      uVar21 = uVar12;
    } while (uVar25 < local_b8[3]);
    uVar24 = local_50 + uVar11;
    if (local_98 <= uVar24) {
      uVar24 = local_98;
    }
    uVar24 = uVar24 + local_58;
    if (uVar24 < local_100) {
LAB_01f3d837:
      uVar17 = local_100 + 0xf;
LAB_01f3d83b:
      if ((local_100 <= uVar24) && (uVar17 != 0)) {
        *(undefined4 *)((long)(hasher->common).extra + 0xc) =
             *(undefined4 *)((hasher->common).extra + 1);
        *(void **)((long)(hasher->common).extra + 4) = (hasher->common).extra[0];
        *(int *)(hasher->common).extra = (int)local_100;
      }
    }
    else {
      uVar21 = (ulong)*(int *)(hasher->common).extra;
      if (local_100 != uVar21) {
        uVar25 = (ulong)*(int *)((long)(hasher->common).extra + 4);
        uVar17 = 1;
        if (local_100 != uVar25) {
          uVar21 = (local_100 + 3) - uVar21;
          if (uVar21 < 7) {
            bVar10 = (byte)((int)uVar21 << 2);
            uVar5 = 0x9750468;
          }
          else {
            uVar25 = (local_100 + 3) - uVar25;
            if (6 < uVar25) {
              uVar17 = 2;
              if ((local_100 != (long)*(int *)((hasher->common).extra + 1)) &&
                 (uVar17 = 3, local_100 != (long)*(int *)((long)(hasher->common).extra + 0xc)))
              goto LAB_01f3d837;
              goto LAB_01f3d83b;
            }
            bVar10 = (byte)((int)uVar25 << 2);
            uVar5 = 0xfdb1ace;
          }
          uVar17 = (ulong)(uVar5 >> (bVar10 & 0x1f) & 0xf);
        }
        goto LAB_01f3d83b;
      }
      uVar17 = 0;
    }
    uVar5 = (uint)uVar12;
    *(uint *)local_d8 = uVar5;
    uVar7 = (uint)uVar26;
    *(uint *)((long)local_d8 + 4) = uVar7;
    uVar24 = (ulong)*(uint *)(literal_context_lut + 0x3c) + 0x10;
    uVar6 = 0;
    if (uVar24 <= uVar17) {
      bVar10 = (byte)*(uint *)(literal_context_lut + 0x38);
      uVar21 = ((4L << (bVar10 & 0x3f)) + (uVar17 - *(uint *)(literal_context_lut + 0x3c))) - 0x10;
      uVar6 = 0x1f;
      uVar18 = (uint)uVar21;
      if (uVar18 != 0) {
        for (; uVar18 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar6 = (uVar6 ^ 0xffffffe0) + 0x1f;
      uVar25 = (ulong)((uVar21 >> ((ulong)uVar6 & 0x3f) & 1) != 0);
      lVar19 = (ulong)uVar6 - (ulong)*(uint *)(literal_context_lut + 0x38);
      uVar17 = (~(-1 << (bVar10 & 0x1f)) & uVar18) + uVar24 +
               (uVar25 + lVar19 * 2 + 0xfffe << (bVar10 & 0x3f)) | lVar19 * 0x400;
      uVar6 = (uint)(uVar21 - (uVar25 + 2 << ((byte)uVar6 & 0x3f)) >> (bVar10 & 0x3f));
    }
    *(short *)((long)local_d8 + 0xe) = (short)uVar17;
    *(uint *)(local_d8 + 1) = uVar6;
    if (5 < uVar12) {
      if (uVar12 < 0x82) {
        uVar5 = 0x1f;
        uVar6 = (uint)(uVar12 - 2);
        if (uVar6 != 0) {
          for (; uVar6 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar5 = (int)(uVar12 - 2 >> ((char)(uVar5 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                (uVar5 ^ 0xffffffe0) * 2 + 0x40;
      }
      else if (uVar12 < 0x842) {
        uVar6 = 0x1f;
        if (uVar5 - 0x42 != 0) {
          for (; uVar5 - 0x42 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar5 = (uVar6 ^ 0xffe0) + 0x2a;
      }
      else {
        uVar5 = 0x15;
        if (0x1841 < uVar12) {
          uVar5 = (uint)(ushort)(0x17 - (uVar12 < 0x5842));
        }
      }
    }
    uVar24 = (ulong)(int)uVar7;
    if (uVar24 < 10) {
      uVar6 = uVar7 - 2;
    }
    else if (uVar24 < 0x86) {
      uVar6 = 0x1f;
      uVar7 = (uint)(uVar24 - 6);
      if (uVar7 != 0) {
        for (; uVar7 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar6 = (int)(uVar24 - 6 >> ((char)(uVar6 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
              (uVar6 ^ 0xffffffe0) * 2 + 0x42;
    }
    else {
      uVar6 = 0x17;
      if (uVar24 < 0x846) {
        uVar6 = 0x1f;
        if (uVar7 - 0x46 != 0) {
          for (; uVar7 - 0x46 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar6 = (uVar6 ^ 0xffe0) + 0x2c;
      }
    }
    uVar3 = (ushort)uVar6;
    sVar4 = (uVar3 & 7) + ((ushort)uVar5 & 7) * 8;
    if ((((uVar17 & 0x3ff) == 0) && ((ushort)uVar5 < 8)) && (uVar3 < 0x10)) {
      if (7 < uVar3) {
        sVar4 = sVar4 + 0x40;
      }
    }
    else {
      iVar15 = ((uVar5 & 0xffff) >> 3) * 3 + ((uVar6 & 0xffff) >> 3);
      sVar4 = sVar4 + ((ushort)(0x520d40 >> ((char)iVar15 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar15 * 0x40 + 0x40;
    }
    *(short *)((long)local_d8 + 0xc) = sVar4;
    *num_commands = *num_commands + uVar12;
    position = uVar26 + uVar11;
    uVar24 = local_40;
    if (position < local_40) {
      uVar24 = position;
    }
    uVar21 = uVar11 + 2;
    if (local_100 < uVar26 >> 2) {
      uVar17 = position + local_100 * -4;
      if (uVar17 < uVar21) {
        uVar17 = uVar21;
      }
      uVar21 = uVar17;
      if (uVar24 < uVar17) {
        uVar21 = uVar24;
      }
    }
    local_90 = uVar11 + local_48 + uVar26 * 2;
    local_d8 = local_d8 + 2;
    for (; uVar21 < uVar24; uVar21 = uVar21 + 1) {
      *(uint *)(sVar2 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                (uVar21 & ringbuffer_mask)) *
                                                      0x7bd3579bd3000000) >> 0x30) +
                                ((uint)uVar21 & 8) & 0xffff) * 4) = (uint)uVar21;
    }
    uVar24 = 0;
    uVar21 = local_60;
  } while( true );
  puVar9 = puVar9 + 1;
  puVar8 = puVar8 + 1;
  uVar16 = uVar16 - 8;
  lVar19 = lVar19 + -8;
  goto LAB_01f3d2b1;
code_r0x01f3d3d3:
  puVar8 = puVar8 + 1;
  puVar9 = puVar9 + 1;
  uVar16 = uVar16 - 8;
  lVar20 = lVar20 + -8;
  goto LAB_01f3d3c2;
code_r0x01f3d5e6:
  puVar8 = puVar8 + 1;
  puVar9 = puVar9 + 1;
  uVar11 = uVar11 - 8;
  lVar19 = lVar19 + -8;
  goto LAB_01f3d5d5;
code_r0x01f3d715:
  puVar8 = puVar8 + 1;
  puVar9 = puVar9 + 1;
  uVar12 = uVar12 - 8;
  lVar20 = lVar20 + -8;
  goto LAB_01f3d704;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}